

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderFramebufferTextureNoFBOBoundToTarget::deinit
          (GeometryShaderFramebufferTextureNoFBOBoundToTarget *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_to_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderFramebufferTextureNoFBOBoundToTarget::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}